

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.h
# Opt level: O2

int __thiscall
pybind11::detail::process_attribute<pybind11::arg,_void>::init
          (process_attribute<pybind11::arg,_void> *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  int extraout_EAX;
  void *local_30;
  handle local_28;
  bool local_1a;
  bool local_19;
  reference pvVar2;
  
  if ((((byte)ctx[0x59] & 0x10) != 0) && (*(long *)(ctx + 0x18) == *(long *)(ctx + 0x20))) {
    local_30 = (void *)0x0;
    local_28.m_ptr = (PyObject *)0x0;
    local_1a = true;
    local_19 = false;
    std::vector<pybind11::detail::argument_record,std::allocator<pybind11::detail::argument_record>>
    ::emplace_back<char_const(&)[5],decltype(nullptr),pybind11::handle,bool,bool>
              ((vector<pybind11::detail::argument_record,std::allocator<pybind11::detail::argument_record>>
                *)(ctx + 0x18),(char (*) [5])0x480b88,&local_30,&local_28,&local_1a,&local_19);
  }
  local_30 = (void *)0x0;
  local_28.m_ptr = (PyObject *)0x0;
  local_1a = (bool)(~(byte)this[8] & 1);
  local_19 = (bool)((byte)this[8] >> 1 & 1);
  pvVar2 = std::
           vector<pybind11::detail::argument_record,std::allocator<pybind11::detail::argument_record>>
           ::emplace_back<char_const*const&,decltype(nullptr),pybind11::handle,bool,bool_const&>
                     ((vector<pybind11::detail::argument_record,std::allocator<pybind11::detail::argument_record>>
                       *)(ctx + 0x18),(char **)this,&local_30,&local_28,&local_1a,&local_19);
  iVar1 = (int)pvVar2;
  if (((byte)ctx[0x59] & 0x80) != 0) {
    process_kw_only_arg((arg *)this,(function_record *)ctx);
    iVar1 = extraout_EAX;
  }
  return iVar1;
}

Assistant:

static void init(const arg &a, function_record *r) {
        if (r->is_method && r->args.empty())
            r->args.emplace_back("self", nullptr, handle(), true /*convert*/, false /*none not allowed*/);
        r->args.emplace_back(a.name, nullptr, handle(), !a.flag_noconvert, a.flag_none);

        if (r->has_kw_only_args) process_kw_only_arg(a, r);
    }